

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedNumberFormat::setContext
          (RuleBasedNumberFormat *this,UDisplayContext value,UErrorCode *status)

{
  char cVar1;
  BreakIterator *pBVar2;
  
  NumberFormat::setContext(&this->super_NumberFormat,value,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((value - UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU < 2) &&
       (this->capitalizationInfoSet == '\0')) {
      initCapitalizationContextInfo(this,&this->locale);
      this->capitalizationInfoSet = '\x01';
    }
    if (this->capitalizationBrkIter == (BreakIterator *)0x0) {
      if (value != UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE) {
        if (value == UDISPCTX_CAPITALIZATION_FOR_STANDALONE) {
          cVar1 = this->capitalizationForStandAlone;
        }
        else {
          if (value != UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU) {
            return;
          }
          cVar1 = this->capitalizationForUIListMenu;
        }
        if (cVar1 == '\0') {
          return;
        }
      }
      *status = U_ZERO_ERROR;
      pBVar2 = BreakIterator::createSentenceInstance(&this->locale,status);
      this->capitalizationBrkIter = pBVar2;
      if (U_ZERO_ERROR < *status) {
        if (pBVar2 != (BreakIterator *)0x0) {
          (*(pBVar2->super_UObject)._vptr_UObject[1])(pBVar2);
        }
        this->capitalizationBrkIter = (BreakIterator *)0x0;
      }
    }
  }
  return;
}

Assistant:

void
RuleBasedNumberFormat::setContext(UDisplayContext value, UErrorCode& status)
{
    NumberFormat::setContext(value, status);
    if (U_SUCCESS(status)) {
    	if (!capitalizationInfoSet &&
    	        (value==UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU || value==UDISPCTX_CAPITALIZATION_FOR_STANDALONE)) {
    	    initCapitalizationContextInfo(locale);
    	    capitalizationInfoSet = TRUE;
        }
#if !UCONFIG_NO_BREAK_ITERATION
        if ( capitalizationBrkIter == NULL && (value==UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE ||
                (value==UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU && capitalizationForUIListMenu) ||
                (value==UDISPCTX_CAPITALIZATION_FOR_STANDALONE && capitalizationForStandAlone)) ) {
            status = U_ZERO_ERROR;
            capitalizationBrkIter = BreakIterator::createSentenceInstance(locale, status);
            if (U_FAILURE(status)) {
                delete capitalizationBrkIter;
                capitalizationBrkIter = NULL;
            }
        }
#endif
    }
}